

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O0

void __thiscall cppmetrics::ScheduledReporter::~ScheduledReporter(ScheduledReporter *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ScheduledReporter *this_local;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__ScheduledReporter_00190b28;
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m_mutex);
  this->m_is_running = false;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
  bVar1 = std::thread::joinable(&this->m_reporter_thread);
  if (bVar1) {
    std::thread::join();
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  std::thread::~thread(&this->m_reporter_thread);
  std::condition_variable::~condition_variable(&this->m_cv);
  std::unique_ptr<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_>::~unique_ptr
            (&this->m_reporter);
  Reporter::~Reporter(&this->super_Reporter);
  return;
}

Assistant:

ScheduledReporter::~ScheduledReporter()
{
  std::unique_lock<std::mutex> lock(m_mutex);
  m_is_running = false;
  m_cv.notify_all();
  lock.unlock();

  if (m_reporter_thread.joinable())
  {
    m_reporter_thread.join();
  }
}